

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::genGatherFuncCall
          (string *__return_storage_ptr__,TextureGatherCase *this,GatherType gatherType,
          TextureFormat *textureFormat,GatherArgs *gatherArgs,string *refZExpr,IVec2 *offsetRange,
          int indentationDepth)

{
  undefined4 in_register_00000014;
  Vector<int,_2> *value;
  Vector<int,_2> *value_00;
  Vector<int,_2> *value_01;
  Vector<int,_2> *value_02;
  Vector<int,_2> *value_03;
  char cVar1;
  uint uVar2;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar2 = (uint)this;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (uVar2 < 4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((*(int *)CONCAT44(in_register_00000014,gatherType) == 0x14) ||
     (*(int *)CONCAT44(in_register_00000014,gatherType) == 0x12)) {
    std::operator+(&local_390,", ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gatherArgs);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_390);
  }
  if (uVar2 - 1 < 3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (uVar2 == 3) {
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      cVar1 = (char)offsetRange;
      std::__cxx11::string::_M_construct((ulong)&local_270,cVar1);
      std::operator+(&local_190,"ivec2[4](\n",&local_270);
      std::operator+(&local_170,&local_190,"\tivec2");
      de::toString<tcu::Vector<int,2>>(&local_1b0,(de *)&textureFormat->type,value_00);
      std::operator+(&local_150,&local_170,&local_1b0);
      std::operator+(&local_130,&local_150,",\n");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_290,cVar1);
      std::operator+(&local_110,&local_130,&local_290);
      std::operator+(&local_f0,&local_110,"\tivec2");
      de::toString<tcu::Vector<int,2>>(&local_1d0,(de *)&textureFormat[1].type,value_01);
      std::operator+(&local_d0,&local_f0,&local_1d0);
      std::operator+(&local_b0,&local_d0,",\n");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar1);
      std::operator+(&local_90,&local_b0,&local_2b0);
      std::operator+(&local_70,&local_90,"\tivec2");
      de::toString<tcu::Vector<int,2>>(&local_1f0,(de *)&textureFormat[2].type,value_02);
      std::operator+(&local_50,&local_70,&local_1f0);
      std::operator+(&local_250,&local_50,",\n");
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_2d0,cVar1);
      std::operator+(&local_230,&local_250,&local_2d0);
      std::operator+(&local_350,&local_230,"\tivec2");
      de::toString<tcu::Vector<int,2>>(&local_210,(de *)&textureFormat[3].type,value_03);
      std::operator+(&local_330,&local_350,&local_210);
      std::operator+(&local_310,&local_330,")\n");
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_2f0,cVar1);
      std::operator+(&local_370,&local_310,&local_2f0);
      std::operator+(&local_390,&local_370,"\t");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      this_00 = &local_270;
    }
    else if (uVar2 == 2) {
      local_230._M_dataplus._M_p._0_4_ =
           (*(int *)((long)&(refZExpr->_M_dataplus)._M_p + 4) -
           *(int *)&(refZExpr->_M_dataplus)._M_p) + 1;
      de::toString<int>(&local_330,(int *)&local_230);
      std::operator+(&local_310,"pixCoord.yx % ivec2(",&local_330);
      std::operator+(&local_370,&local_310,") + ");
      local_250._M_dataplus._M_p._0_4_ = *(undefined4 *)&(refZExpr->_M_dataplus)._M_p;
      de::toString<int>(&local_350,(int *)&local_250);
      std::operator+(&local_390,&local_370,&local_350);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_310);
      this_00 = &local_330;
    }
    else {
      de::toString<tcu::Vector<int,2>>(&local_370,(de *)&textureFormat->type,value);
      std::operator+(&local_390,"ivec2",&local_370);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_390);
      this_00 = &local_370;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (-1 < (int)textureFormat->order) {
    de::toString<int>(&local_370,(int *)textureFormat);
    std::operator+(&local_390,", ",&local_370);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TextureGatherCase::genGatherFuncCall (GatherType gatherType, const tcu::TextureFormat& textureFormat, const GatherArgs& gatherArgs, const string& refZExpr, const IVec2& offsetRange, int indentationDepth)
{
	string result;

	switch (gatherType)
	{
		case GATHERTYPE_BASIC:
			result += "textureGather";
			break;
		case GATHERTYPE_OFFSET: // \note Fallthrough.
		case GATHERTYPE_OFFSET_DYNAMIC:
			result += "textureGatherOffset";
			break;
		case GATHERTYPE_OFFSETS:
			result += "textureGatherOffsets";
			break;
		default:
			DE_ASSERT(false);
	}

	result += "(u_sampler, v_texCoord";

	if (isDepthFormat(textureFormat))
	{
		DE_ASSERT(gatherArgs.componentNdx < 0);
		result += ", " + refZExpr;
	}

	if (gatherType == GATHERTYPE_OFFSET ||
		gatherType == GATHERTYPE_OFFSET_DYNAMIC ||
		gatherType == GATHERTYPE_OFFSETS)
	{
		result += ", ";
		switch (gatherType)
		{
			case GATHERTYPE_OFFSET:
				result += "ivec2" + de::toString(gatherArgs.offsets[0]);
				break;

			case GATHERTYPE_OFFSET_DYNAMIC:
				result += "pixCoord.yx % ivec2(" + de::toString(offsetRange.y() - offsetRange.x() + 1) + ") + " + de::toString(offsetRange.x());
				break;

			case GATHERTYPE_OFFSETS:
				result += "ivec2[4](\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[0]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[1]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[2]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[3]) + ")\n"
						  + string(indentationDepth, '\t') + "\t";
				break;

			default:
				DE_ASSERT(false);
		}
	}

	if (gatherArgs.componentNdx >= 0)
	{
		DE_ASSERT(gatherArgs.componentNdx < 4);
		result += ", " + de::toString(gatherArgs.componentNdx);
	}

	result += ")";

	return result;
}